

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

ostream * test_detail::print_tuple_impl<std::tuple<int,std::__cxx11::string,int>,0ul,1ul,2ul>
                    (ostream *stream,int *t)

{
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  std::ostream::operator<<(stream,t[10]);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,*(char **)(t + 2),*(long *)(t + 4));
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  std::ostream::operator<<(stream,*t);
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }